

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

void * utf8str(void *haystack,void *needle)

{
  long lVar1;
  char cVar2;
  long lVar3;
  char *h;
  bool bVar4;
  
  if (*needle != '\0') {
    cVar2 = *haystack;
    while (cVar2 != '\0') {
      lVar3 = 0;
      while (cVar2 == *(char *)((long)needle + lVar3)) {
        lVar1 = lVar3 + 1;
        lVar3 = lVar3 + 1;
        cVar2 = *(char *)((long)haystack + lVar1);
      }
      if (*(char *)((long)needle + lVar3) == '\0') {
        return haystack;
      }
      haystack = (void *)((long)haystack + lVar3);
      bVar4 = cVar2 != '\0';
      cVar2 = '\0';
      if (bVar4) {
        cVar2 = *(char *)((long)haystack + 1);
        haystack = (void *)((long)haystack + 1);
      }
    }
    haystack = (void *)0x0;
  }
  return haystack;
}

Assistant:

void *utf8str(const void *haystack, const void *needle) {
  const char *h = (const char *)haystack;

  // if needle has no utf8 codepoints before the null terminating
  // byte then return haystack
  if ('\0' == *((const char *)needle)) {
    return (void *)haystack;
  }

  while ('\0' != *h) {
    const char *maybeMatch = h;
    const char *n = (const char *)needle;

    while (*h == *n) {
      n++;
      h++;
    }

    if ('\0' == *n) {
      // we found the whole utf8 string for needle in haystack at
      // maybeMatch, so return it
      return (void *)maybeMatch;
    } else {
      // h could be in the middle of an unmatching utf8 codepoint,
      // so we need to march it on to the next character beginning,
      if ('\0' != *h) {
        do {
          h++;
        } while (0x80 == (0xc0 & *h));
      }
    }
  }

  // no match
  return 0;
}